

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve_algorithms.cpp
# Opt level: O1

ValueRep __thiscall
Clasp::BasicSolve::State::solve(State *this,Solver *s,SolveParams *p,SolveLimits *lim)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  uint32 uVar4;
  uint uVar5;
  uint64 uVar6;
  ulong uVar7;
  long lVar8;
  LimitPtr pDVar9;
  LimitPtr pDVar10;
  LimitPtr pDVar11;
  uint uVar12;
  LimitPtr pDVar13;
  DynamicLimit *this_00;
  long *plVar14;
  LimitPtr pDVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  DBInfo DVar19;
  RestartSchedule rs;
  ScheduleStrategy dbGrow;
  EventType progress;
  WeightLitVec inDegree;
  uint local_138;
  uint local_134;
  LimitPtr local_130;
  ScheduleStrategy local_128;
  uint64 local_110;
  ReduceStrategy *local_108;
  uint local_fc;
  ScheduleStrategy local_f8;
  SearchLimits local_e8;
  SearchLimits local_a8;
  WeightLitVec local_68;
  SolveLimits *local_58;
  ScheduleStrategy *local_50;
  ScheduleStrategy local_48;
  
  if (s->enum_ == (Constraint *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = (uint)*(byte *)((long)&s->enum_[7]._vptr_Constraint + 5);
  }
  if (((s->conflict_).ebo_.size == 0) || ((s->levels_).super_type.ebo_.size != (s->levels_).root)) {
    if (this->resetState == true) {
      SingleOwnerPtr<Clasp::DynamicLimit,_Clasp::DeleteObject>::reset
                (&this->dynRestart,(DynamicLimit *)0x0);
      SingleOwnerPtr<Clasp::BlockLimit,_Clasp::DeleteObject>::reset
                (&this->rsBlock,(BlockLimit *)0x0);
      State(this,s,p);
    }
    local_68.ebo_.buf = (pointer)0x0;
    local_68.ebo_.size = 0;
    local_68.ebo_.cap = 0;
    SearchLimits::SearchLimits(&local_e8);
    local_128._0_8_ = *(undefined8 *)&(p->restart).rsSched.super_ScheduleStrategy;
    local_128.len = (p->restart).rsSched.super_ScheduleStrategy.len;
    local_128.grow = (p->restart).rsSched.super_ScheduleStrategy.grow;
    local_f8._0_8_ = *(undefined8 *)&(p->reduce).growSched;
    local_f8.len = (p->reduce).growSched.len;
    local_f8.grow = (p->reduce).growSched.grow;
    local_134 = this->dbPinned;
    local_50 = &this->dbRed;
    local_fc = uVar5;
    local_58 = lim;
    uVar6 = ScheduleStrategy::current(local_50);
    uVar5 = this->dbRedInit;
    pDVar15 = (LimitPtr)this->dbGrowNext;
    pDVar13 = (LimitPtr)local_58->conflicts;
    local_110 = local_58->restarts;
    if ((local_f8._0_8_ & 0x3fffffff) != 0) {
      ScheduleStrategy::advanceTo(&local_f8,this->nGrow);
    }
    uVar4 = this->nRestart;
    if ((uVar4 == 0xffffffff) &&
       ((*(ulong *)&(p->restart).field_0x18 & 0x3000000000000000) == 0x2000000000000000)) {
      SearchLimits::SearchLimits(&local_a8);
      local_e8.used =
           CONCAT44(local_a8.used._4_4_,CONCAT22(local_a8.used._2_2_,(ushort)local_a8.used));
      local_e8.memory._0_4_ = (undefined4)local_a8.memory;
      local_e8.memory._4_4_ = local_a8.memory._4_4_;
      local_e8.learnts = local_a8.learnts;
      local_e8.restart.local = local_a8.restart.local;
      local_e8.restart._25_7_ = local_a8.restart._25_7_;
      local_e8.conflicts._0_4_ = (undefined4)local_a8.conflicts;
      local_e8.conflicts._4_4_ = local_a8.conflicts._4_4_;
      local_e8.restart.dynamic = local_a8.restart.dynamic;
      local_e8.restart.conflicts = local_a8.restart.conflicts;
    }
    else if (((uint)local_128._0_4_ < 0xc0000000) ||
            (this_00 = (DynamicLimit *)((this->dynRestart).ptr_ & 0xfffffffffffffffe),
            this_00 == (DynamicLimit *)0x0)) {
      if ((local_128._0_8_ & 0x3fffffff) == 0) {
        uVar4 = local_128._0_4_ & 0x3fffffff;
      }
      ScheduleStrategy::advanceTo(&local_128,uVar4);
      local_e8.restart.conflicts = ScheduleStrategy::current(&local_128);
    }
    else {
      if (uVar4 == 0) {
        DynamicLimit::resetAdjust
                  (this_00,local_128.grow,lbd_limit,-(uint)(local_128.len == 0xffffffff) | 16000,
                   true);
      }
      local_e8.restart.dynamic = (LimitPtr)((this->dynRestart).ptr_ & 0xfffffffffffffffe);
      uVar4 = ((local_e8.restart.dynamic)->adjust).limit;
      uVar12 = ((local_e8.restart.dynamic)->adjust).samples;
      uVar3 = uVar4 - 1;
      if (uVar3 < uVar12) {
        uVar12 = uVar3;
      }
      local_e8.restart.conflicts = (uint64)(uVar4 - uVar12);
    }
    local_e8.restart._24_8_ =
         CONCAT71(local_e8.restart._25_7_,
                  (byte)((ulong)*(undefined8 *)&(p->restart).field_0x18 >> 0x3e)) &
         0xffffffffffffff01;
    local_e8.restart.block = (BlockPtr)((this->rsBlock).ptr_ & 0xfffffffffffffffe);
    uVar7 = (ulong)(p->reduce).memMax;
    if (uVar7 != 0) {
      lVar8 = uVar7 << 0x14;
      local_e8.memory._0_4_ = (undefined4)lVar8;
      local_e8.memory._4_4_ = (undefined4)((ulong)lVar8 >> 0x20);
    }
    local_a8.restart.dynamic = (LimitPtr)0x0;
    local_a8.restart.block._0_4_ = 0;
    local_a8.used._0_4_ =
         (Event_t<Clasp::BasicSolveEvent>::id_s & 0xffff) * 0x1000 +
         (local_a8.used._2_2_ & 0xf000) * 0x10000 + 0x52f;
    local_a8.restart.conflicts = (uint64)s;
    if (pDVar13 == (LimitPtr)0x0) {
      local_138 = 0;
      pDVar13 = (LimitPtr)0x0;
    }
    else {
      local_130 = (LimitPtr)(uVar6 + uVar5);
      local_108 = &(p->reduce).strategy;
      do {
        pDVar9 = (LimitPtr)
                 (-(ulong)((*(ulong *)&(p->restart).field_0x18 & 0x4000000000000000) != 0) |
                 local_e8.restart.conflicts);
        local_e8.used = 0;
        dVar16 = (double)((int)(p->reduce).strategy >> 0x1f & local_134) + this->dbMax;
        dVar17 = this->dbHigh;
        if (dVar16 <= this->dbHigh) {
          dVar17 = dVar16;
        }
        local_e8.learnts = (uint32)(long)dVar17;
        if (pDVar13 < pDVar9) {
          pDVar9 = pDVar13;
        }
        local_a8.restart.dynamic = local_130;
        if (pDVar15 < local_130) {
          local_a8.restart.dynamic = pDVar15;
        }
        if (pDVar9 < local_a8.restart.dynamic) {
          local_a8.restart.dynamic = pDVar9;
        }
        local_e8.conflicts._0_4_ = SUB84(local_a8.restart.dynamic,0);
        local_e8.conflicts._4_4_ = (undefined4)((ulong)local_a8.restart.dynamic >> 0x20);
        local_a8.restart.block._0_4_ = local_e8.learnts;
        if (((uint)local_a8.used & 0xff0) != 0) {
          SharedContext::report(s->shared_,(Event *)&local_a8);
          local_a8.used._0_4_ = (uint)local_a8.used & 0xfffff00f;
        }
        bVar1 = Solver::search(s,&local_e8,(double)p->randProb);
        local_138 = (uint)bVar1;
        pDVar9 = (LimitPtr)local_e8.used;
        if ((LimitPtr)CONCAT44(local_e8.conflicts._4_4_,(undefined4)local_e8.conflicts) <
            local_e8.used) {
          pDVar9 = (LimitPtr)CONCAT44(local_e8.conflicts._4_4_,(undefined4)local_e8.conflicts);
        }
        pDVar15 = (LimitPtr)((long)pDVar15 - (long)pDVar9);
        pDVar13 = (LimitPtr)((long)pDVar13 - (long)pDVar9);
        if (bVar1 != 0) {
          uVar5 = (uint)local_a8.used & 0xfffff00f;
          local_a8.used._0_2_ = (ushort)uVar5 | 0x450;
          local_a8.used._2_2_ = (ushort)(uVar5 >> 0x10);
          if (bVar1 == 1) {
            uVar5 = (uint)((ulong)*(undefined8 *)&(p->restart).field_0x18 >> 0x3c) & 3;
            if (uVar5 == 1) {
              uVar4 = 0;
            }
            else {
              if (uVar5 != 2) goto LAB_00166360;
              uVar4 = 0xffffffff;
            }
            this->nRestart = uVar4;
          }
LAB_00166360:
          if ((local_f8._0_8_ & 0x3fffffff) != 0) {
            this->dbGrowNext = (long)&(pDVar15->adjust).limit + (ulong)(pDVar15 == (LimitPtr)0x0);
          }
          SharedContext::report(s->shared_,(Event *)&local_a8);
          break;
        }
        bVar2 = Solver::restartReached(s,&local_e8);
        if (bVar2) {
          uVar3 = this->nRestart + 1;
          this->nRestart = uVar3;
          uVar5 = *(uint *)&(p->restart).field_0x18;
          uVar12 = uVar5 & 0xffff;
          if ((uVar12 != 0) && (uVar3 % uVar12 == 0)) {
            local_68.ebo_._8_8_ = local_68.ebo_._8_8_ & 0xffffffff00000000;
            uVar7 = (s->heuristic_).ptr_;
            uVar4 = Solver::inDegree(s,&local_68);
            plVar14 = (long *)(uVar7 & 0xfffffffffffffffe);
            (**(code **)(*plVar14 + 0x58))
                      ((double)(uVar5 >> 0x10) / (double)uVar4,plVar14,s,&local_68);
          }
          if (local_e8.restart.dynamic == (DynamicLimit *)0x0) {
            local_e8.restart.conflicts = ScheduleStrategy::next(&local_128);
            pDVar11 = (LimitPtr)local_e8.restart.conflicts;
          }
          else {
            uVar5 = (local_e8.restart.dynamic)->num_;
            uVar4 = DynamicLimit::restart(local_e8.restart.dynamic,local_128.len,local_128.grow);
            local_e8.restart.conflicts = (uint64)uVar4;
            pDVar11 = (LimitPtr)(ulong)uVar5;
          }
          Solver::restart(s);
          if ((*(ushort *)&local_108->field_0x2 & 0x1fc) != 0) {
            DVar19 = Solver::reduceLearnts
                               (s,(float)((uint)(p->reduce).strategy >> 0x12 & 0x7f) / 100.0,
                                local_108);
            local_134 = DVar19.pinned;
          }
          if (this->nRestart == this->rsShuffle) {
            this->rsShuffle =
                 ((uint)((ulong)*(undefined8 *)&(p->restart).field_0x18 >> 0x2e) & 0x3fff) +
                 this->rsShuffle;
            s->field_0x207 = s->field_0x207 | 0x40;
          }
          local_110 = local_110 - 1;
          if (local_110 == 0) {
            local_110 = 0;
            break;
          }
          (s->stats).super_CoreStats.lastRestart = (s->stats).super_CoreStats.analyzed;
          uVar5 = (uint)local_a8.used & 0xfffff00f;
          local_a8.used._0_2_ = (ushort)(uVar5 | 0x520);
          local_a8.used._2_2_ = (ushort)(uVar5 >> 0x10);
        }
        else {
          pDVar11 = pDVar9;
          if ((*(ulong *)&(p->restart).field_0x18 & 0x4000000000000000) == 0) {
            bVar2 = pDVar9 <= local_e8.restart.conflicts;
            pDVar10 = (LimitPtr)(local_e8.restart.conflicts - (long)pDVar9);
            local_e8.restart.conflicts = (uint64)(LimitPtr)0x0;
            if (bVar2) {
              local_e8.restart.conflicts = (uint64)pDVar10;
            }
          }
        }
        local_130 = (LimitPtr)((long)local_130 - (long)pDVar9);
        if (local_130 == (LimitPtr)0x0) {
LAB_001660bb:
          DVar19 = Solver::reduceLearnts
                             (s,(float)((uint)(p->reduce).strategy >> 0xb & 0x7f) / 100.0,local_108)
          ;
          local_134 = DVar19.pinned;
          uVar5 = this->dbRedInit;
          if (local_130 == (LimitPtr)0x0) {
            local_130 = (LimitPtr)ScheduleStrategy::next(local_50);
          }
          else {
            local_130 = (LimitPtr)ScheduleStrategy::current(local_50);
          }
          uVar3 = ((uint)local_a8.used & 0xff0) >> 4;
          if (uVar3 < 0x45) {
            uVar3 = 0x44;
          }
          uVar12 = (uint)local_a8.used & 0xfffff00f;
          local_a8.used._0_2_ = (ushort)uVar12 | (ushort)(uVar3 << 4);
          local_a8.used._2_2_ = (ushort)(uVar12 >> 0x10);
          bVar2 = Solver::reduceReached(s,&local_e8);
          local_130 = (LimitPtr)((long)local_130 + (ulong)uVar5);
          if ((bVar2) || (this->dbMax <= (double)local_134)) {
            local_48._0_4_ = 0x14025800;
            DVar19 = Solver::reduceLearnts(s,0.5,(ReduceStrategy *)&local_48);
            if (local_e8.learnts <= DVar19.size) {
              dVar17 = (double)(s->learnts_).ebo_.size / 10.0;
              if (dVar17 <= 100.0) {
                dVar17 = 100.0;
              }
              dVar17 = dVar17 + this->dbMax;
              dVar16 = this->dbHigh;
              if (dVar17 <= this->dbHigh) {
                dVar16 = dVar17;
              }
              this->dbMax = dVar16;
            }
            local_134 = local_134 >> 1;
          }
        }
        else {
          bVar2 = Solver::reduceReached(s,&local_e8);
          if (bVar2) goto LAB_001660bb;
        }
        if (pDVar15 == (LimitPtr)0x0) {
LAB_00166213:
          pDVar11 = (LimitPtr)ScheduleStrategy::next(&local_f8);
          this->nGrow = this->nGrow + 1;
          pDVar15 = pDVar11;
LAB_0016622c:
          lVar8 = (long)&(pDVar11->adjust).limit + (ulong)(s->learnts_).ebo_.size;
          auVar18._8_4_ = (int)((ulong)lVar8 >> 0x20);
          auVar18._0_8_ = lVar8;
          auVar18._12_4_ = 0x45300000;
          if (this->dbMax <
              (auVar18._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) {
            this->dbMax = this->dbMax * (double)(p->reduce).fGrow;
            uVar5 = ((uint)local_a8.used & 0xff0) >> 4;
            if (uVar5 < 0x48) {
              uVar5 = 0x47;
            }
            uVar3 = (uint)local_a8.used & 0xfffff00f;
            local_a8.used._0_2_ = (ushort)uVar3 | (ushort)(uVar5 << 4);
            local_a8.used._2_2_ = (ushort)(uVar3 >> 0x10);
          }
          if (this->dbHigh < this->dbMax) {
            this->dbMax = this->dbHigh;
            ScheduleStrategy::ScheduleStrategy(&local_48,Geometric,0,1.5,0);
            local_f8._0_8_ = CONCAT44(local_48.idx,local_48._0_4_);
            local_f8.len = local_48.len;
            local_f8.grow = local_48.grow;
            pDVar15 = (LimitPtr)0xffffffffffffffff;
          }
        }
        else if ((local_f8._0_4_ == 0x40000000) && (((uint)local_a8.used & 0xff0) == 0x520)) {
          if (pDVar15 == (LimitPtr)0x0) goto LAB_00166213;
          goto LAB_0016622c;
        }
      } while (pDVar13 != (LimitPtr)0x0);
    }
    this->dbPinned = local_134;
    this->resetState = (local_fc & local_138) != 0;
    (s->stats).super_CoreStats.lastRestart =
         (s->stats).super_CoreStats.analyzed - (s->stats).super_CoreStats.lastRestart;
    if ((local_58->conflicts & local_58->restarts) != 0xffffffffffffffff) {
      if (local_58->conflicts != 0xffffffffffffffff) {
        local_58->conflicts = (uint64)pDVar13;
      }
      if (local_58->restarts != 0xffffffffffffffff) {
        local_58->restarts = local_110;
      }
    }
    if (local_68.ebo_.buf != (pointer)0x0) {
      operator_delete(local_68.ebo_.buf);
    }
  }
  else {
    this->resetState = (bool)(this->resetState | (byte)((uVar5 & 2) >> 1));
    local_138._0_1_ = '\x02';
  }
  return (ValueRep)local_138;
}

Assistant:

ValueRep BasicSolve::State::solve(Solver& s, const SolveParams& p, SolveLimits& lim) {
	assert(!lim.reached());
	const uint32 resetMode = s.enumerationConstraint() ? static_cast<const EnumerationConstraint*>(s.enumerationConstraint())->resetMode() : 0u;
	if (s.hasConflict() && s.decisionLevel() == s.rootLevel()) {
		resetState = resetState || (resetMode & value_false) != 0;
		return value_false;
	}
	struct ConflictLimits {
		uint64 reduce;  // current reduce limit
		uint64 grow;    // current limit for next growth operation
		uint64 restart; // current restart limit
		uint64 global;  // current global limit
		uint64 min()      const { return std::min(std::min(reduce, grow), std::min(restart, global)); }
		void  update(uint64 x)  { reduce -= x; grow -= x; restart -= x; global -= x; }
	};
	if (resetState) {
		this->~State();
		new (this) State(s, p);
	}
	WeightLitVec inDegree;
	SearchLimits     sLimit;
	RestartSchedule  rs     = p.restart.rsSched;
	ScheduleStrategy dbGrow = p.reduce.growSched;
	Solver::DBInfo   db     = {0,0,dbPinned};
	ValueRep         result = value_free;
	ConflictLimits   cLimit = {dbRed.current() + dbRedInit, dbGrowNext, UINT64_MAX, lim.conflicts};
	uint64      limRestarts = lim.restarts;
	if (!dbGrow.disabled())  { dbGrow.advanceTo(nGrow); }
	if (nRestart == UINT32_MAX && p.restart.update() == RestartParams::seq_disable) {
		sLimit = SearchLimits();
	}
	else if (rs.isDynamic() && dynRestart.get()) {
		if (!nRestart) dynRestart->resetAdjust(rs.k(), DynamicLimit::lbd_limit, rs.adjustLim(), true);
		sLimit.restart.dynamic   = dynRestart.get();
		sLimit.restart.conflicts = dynRestart->adjust.limit - std::min(dynRestart->adjust.samples, dynRestart->adjust.limit - 1);
	}
	else {
		rs.advanceTo(!rs.disabled() ? nRestart : 0);
		sLimit.restart.conflicts = rs.current();
	}
	sLimit.restart.local = p.restart.local();
	sLimit.restart.block = rsBlock.get();
	if (p.reduce.memMax) {
		sLimit.memory = static_cast<uint64>(p.reduce.memMax)<<20;
	}
	uint64 n = 0;
	for (EventType progress(s, EventType::event_restart, 0, 0); cLimit.global; ) {
		cLimit.restart   = !p.restart.local() ? sLimit.restart.conflicts : UINT64_MAX;
		sLimit.used      = 0;
		sLimit.learnts   = (uint32)std::min(dbMax + (db.pinned*p.reduce.strategy.noGlue), dbHigh);
		sLimit.conflicts = cLimit.min(); assert(sLimit.conflicts);
		progress.cLimit  = sLimit.conflicts;
		progress.lLimit  = sLimit.learnts;
		if (progress.op) { s.sharedContext()->report(progress); progress.op = (uint32)EventType::event_none; }
		result = s.search(sLimit, p.randProb);
		cLimit.update(n = std::min(sLimit.used, sLimit.conflicts)); // number of conflicts in this iteration
		if (result != value_free) {
			progress.op = static_cast<uint32>(EventType::event_exit);
			if (result == value_true && p.restart.update() != RestartParams::seq_continue) {
				if      (p.restart.update() == RestartParams::seq_repeat) { nRestart = 0; }
				else if (p.restart.update() == RestartParams::seq_disable){ nRestart = UINT32_MAX; }
			}
			if (!dbGrow.disabled()) { dbGrowNext = std::max(cLimit.grow, uint64(1)); }
			s.sharedContext()->report(progress);
			break;
		}
		if (s.restartReached(sLimit)) {
			// restart reached - do restart
			++nRestart;
			if (p.restart.counterRestart && (nRestart % p.restart.counterRestart) == 0 ) {
				inDegree.clear();
				s.heuristic()->bump(s, inDegree, p.restart.counterBump / (double)s.inDegree(inDegree));
			}
			if (sLimit.restart.dynamic) {
				n = sLimit.restart.dynamic->runLen();
				sLimit.restart.conflicts = sLimit.restart.dynamic->restart(rs.lbdLim(), rs.k());
			}
			else {
				sLimit.restart.conflicts = n = rs.next();
			}
			s.restart();
			if (p.reduce.strategy.fRestart){ db        = s.reduceLearnts(p.reduce.fRestart(), p.reduce.strategy); }
			if (nRestart == rsShuffle)     { rsShuffle+= p.restart.shuffleNext; s.shuffleOnNextSimplify();}
			if (--limRestarts == 0)        { break; }
			s.stats.lastRestart = s.stats.analyzed;
			progress.op         = (uint32)EventType::event_restart;
		}
		else if (!p.restart.local()) {
			sLimit.restart.conflicts -= std::min(n, sLimit.restart.conflicts);
		}
		if (cLimit.reduce == 0 || s.reduceReached(sLimit)) {
			// reduction reached - remove learnt constraints
			db              = s.reduceLearnts(p.reduce.fReduce(), p.reduce.strategy);
			cLimit.reduce   = dbRedInit + (cLimit.reduce == 0 ? dbRed.next() : dbRed.current());
			progress.op     = std::max(progress.op, (uint32)EventType::event_deletion);
			if (s.reduceReached(sLimit) || db.pinned >= dbMax) {
				ReduceStrategy t; t.algo = 2; t.score = 2; t.glue = 0;
				db.pinned /= 2;
				db.size    = s.reduceLearnts(0.5f, t).size;
				if (db.size >= sLimit.learnts) { dbMax = std::min(dbMax + std::max(100.0, s.numLearntConstraints()/10.0), dbHigh); }
			}
		}
		if (cLimit.grow == 0 || (dbGrow.defaulted() && progress.op == (uint32)EventType::event_restart)) {
			// grow sched reached - increase max db size
			if (cLimit.grow == 0)                      { cLimit.grow = n = dbGrow.next(); ++nGrow; }
			if ((s.numLearntConstraints() + n) > dbMax){ dbMax  *= p.reduce.fGrow; progress.op = std::max(progress.op, (uint32)EventType::event_grow); }
			if (dbMax > dbHigh)                        { dbMax   = dbHigh; cLimit.grow = UINT64_MAX; dbGrow = ScheduleStrategy::none(); }
		}
	}
	dbPinned            = db.pinned;
	resetState          = (resetMode & result) != 0u;
	s.stats.lastRestart = s.stats.analyzed - s.stats.lastRestart;
	if (lim.enabled()) {
		if (lim.conflicts != UINT64_MAX) { lim.conflicts = cLimit.global; }
		if (lim.restarts  != UINT64_MAX) { lim.restarts  = limRestarts;   }
	}
	return result;
}